

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall ImgfsFile::FileEntry::listentry(FileEntry *this,ImgfsFile *imgfs)

{
  uint uVar1;
  uint uVar2;
  _Alloc_hider _Var3;
  uint32_t uVar4;
  size_t sVar5;
  uint uVar6;
  anon_class_16_2_150f306b fn;
  string local_130;
  element_type *local_110;
  ulong local_108;
  element_type *local_100;
  string local_f8;
  exe_reconstructor exe;
  
  if (g_verbose < 2) {
    uVar4 = DirEntry::offset(&this->super_DirEntry);
    uVar1 = (this->super_DirEntry)._size;
    uVar6 = 0x4d;
    if ((this->super_DirEntry)._magic == 0xfffff6fe) {
      uVar6 = 0x46;
    }
    uVar2 = this->_sectionlist;
    local_108 = CONCAT44(local_108._4_4_,this->_attr);
    unixtime2string_abi_cxx11_((string *)&exe,this->_filetime / 10000000 - 0x2b6109100);
    local_110 = exe._e32rom.
                super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    stringformat_abi_cxx11_
              (&local_130,"i->%08x:%08x",(ulong)(this->super_DirEntry)._indexptr,
               (ulong)(this->super_DirEntry)._indexsize);
    _Var3._M_p = local_130._M_dataplus._M_p;
    nameinfo::name_abi_cxx11_(&local_f8,&this->_name,imgfs);
    printf("%08x: %c:s->%08x %9d [%08x] %s  %s %s\n",(ulong)uVar4,(ulong)uVar6,(ulong)uVar2,
           (ulong)uVar1,local_108 & 0xffffffff,local_110,_Var3._M_p,local_f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_00128175;
  }
  else {
    sVar5 = DirEntry::calc_compressed_size(&this->super_DirEntry,imgfs);
    uVar4 = DirEntry::offset(&this->super_DirEntry);
    uVar1 = (this->super_DirEntry)._size;
    uVar6 = 0x4d;
    if ((this->super_DirEntry)._magic == 0xfffff6fe) {
      uVar6 = 0x46;
    }
    local_110 = (element_type *)CONCAT44(local_110._4_4_,this->_sectionlist);
    local_108 = (ulong)this->_attr;
    unixtime2string_abi_cxx11_((string *)&exe,this->_filetime / 10000000 - 0x2b6109100);
    local_100 = exe._e32rom.
                super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    stringformat_abi_cxx11_
              (&local_130,"i->%08x:%08x",(ulong)(this->super_DirEntry)._indexptr,
               (ulong)(this->super_DirEntry)._indexsize);
    _Var3._M_p = local_130._M_dataplus._M_p;
    nameinfo::name_abi_cxx11_(&local_f8,&this->_name,imgfs);
    printf("%08x: %c:s->%08x %9d %9d [%08x] %s  %s %s\n",(ulong)uVar4,(ulong)uVar6,
           (ulong)local_110 & 0xffffffff,(ulong)uVar1,sVar5 & 0xffffffff,local_108,local_100,
           _Var3._M_p,local_f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_00128175;
  }
  operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
LAB_00128175:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (exe._e32rom.super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)&exe._o32rom) {
    operator_delete(exe._e32rom.
                    super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    ,(ulong)((long)&((exe._o32rom.
                                      super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<exe_reconstructor::o32rom,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + 1));
  }
  section_enumerator<ImgfsFile::FileEntry::listentry(ImgfsFile&)::_lambda(std::shared_ptr<ImgfsFile::SectionEntry>)_1_>
            (this,imgfs,(anon_class_8_1_a814aef0)imgfs);
  if ((g_verbose != 0) && (this->_sectionlist != 0)) {
    exe._cputype = (uint16_t)imgfs->_cputype;
    exe._rvamap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &exe._rvamap._M_t._M_impl.super__Rb_tree_header._M_header;
    exe._rvamap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    exe._rvamap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    exe._e32rom.super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    exe._e32rom.super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    exe._o32rom.
    super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    exe._o32rom.
    super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    exe._o32rom.
    super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    exe._e32exe.super___shared_ptr<exe_reconstructor::e32exe,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    exe._e32exe.super___shared_ptr<exe_reconstructor::e32exe,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    exe._o32exe.
    super__Vector_base<std::shared_ptr<exe_reconstructor::o32exe>,_std::allocator<std::shared_ptr<exe_reconstructor::o32exe>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    exe._o32exe.
    super__Vector_base<std::shared_ptr<exe_reconstructor::o32exe>,_std::allocator<std::shared_ptr<exe_reconstructor::o32exe>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    exe._o32exe.
    super__Vector_base<std::shared_ptr<exe_reconstructor::o32exe>,_std::allocator<std::shared_ptr<exe_reconstructor::o32exe>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    exe._sections.
    super__Vector_base<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    exe._sections.
    super__Vector_base<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    exe._sections.
    super__Vector_base<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    exe._rvamap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    exe._rvamap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         exe._rvamap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    DirEntry::getdatablock((ByteVector *)&local_130,&this->super_DirEntry,imgfs);
    exe_reconstructor::add_pe_data(&exe,(ByteVector *)&local_130);
    if (local_130._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_130._M_dataplus._M_p,
                      local_130.field_2._M_allocated_capacity - (long)local_130._M_dataplus._M_p);
    }
    fn.exe = &exe;
    fn.imgfs = imgfs;
    section_enumerator<ImgfsFile::FileEntry::listentry(ImgfsFile&)::_lambda(std::shared_ptr<ImgfsFile::SectionEntry>)_2_>
              (this,imgfs,fn);
    exe_reconstructor::printexe(&exe);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_exe_reconstructor::infoitem>,_std::_Select1st<std::pair<const_unsigned_int,_exe_reconstructor::infoitem>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_exe_reconstructor::infoitem>_>_>
    ::~_Rb_tree(&exe._rvamap._M_t);
    std::
    vector<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
    ::~vector(&exe._sections);
    std::
    vector<std::shared_ptr<exe_reconstructor::o32exe>,_std::allocator<std::shared_ptr<exe_reconstructor::o32exe>_>_>
    ::~vector(&exe._o32exe);
    if (exe._e32exe.super___shared_ptr<exe_reconstructor::e32exe,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (exe._e32exe.
                 super___shared_ptr<exe_reconstructor::e32exe,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    vector<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
    ::~vector(&exe._o32rom);
    if (exe._e32rom.super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (exe._e32rom.
                 super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void listentry(ImgfsFile& imgfs)
        {
            if (g_verbose>1) {
                size_t compsize= calc_compressed_size(imgfs);
                printf("%08x: %c:s->%08x %9d %9d [%08x] %s  %s %s\n",
                        offset(), _magic==MAGIC?'F':'M', _sectionlist, _size, int(compsize), _attr,
                        unixtime2string(getunixtime()).c_str(), entstring().c_str(), _name.name(imgfs).c_str());
            }
            else {
                printf("%08x: %c:s->%08x %9d [%08x] %s  %s %s\n",
                        offset(), _magic==MAGIC?'F':'M', _sectionlist, _size, _attr,
                        unixtime2string(getunixtime()).c_str(), entstring().c_str(), _name.name(imgfs).c_str());
            }

            section_enumerator(imgfs,
                [&imgfs](SectionEntry_ptr section) {
                    section->listsection(imgfs);
                }
            );
            if (g_verbose && _sectionlist) {

                exe_reconstructor exe(imgfs.cputype());
                exe.add_pe_data(getdatablock(imgfs));
                section_enumerator(imgfs,
                    [&imgfs,&exe](SectionEntry_ptr section) {
                        exe.add_sectioninfo(section->ni().shortname(), section->size(), section->getdatareader(imgfs));
                    }
                );

                exe.printexe();
            }
        }